

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarHeader
          (Scanner *this,char *ChompingIndicator,uint *IndentIndicator,bool *IsDone)

{
  iterator pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  iterator Position;
  iterator pcVar5;
  bool bVar6;
  Child local_60;
  iterator local_58;
  long local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  pcVar1 = this->Current;
  cVar2 = scanBlockChompingIndicator(this);
  *ChompingIndicator = cVar2;
  uVar4 = scanBlockIndentationIndicator(this);
  *IndentIndicator = uVar4;
  if (*ChompingIndicator == ' ') {
    cVar2 = scanBlockChompingIndicator(this);
    *ChompingIndicator = cVar2;
  }
  Position = this->Current;
  do {
    pcVar5 = skip_s_white(this,Position);
    bVar6 = pcVar5 != Position;
    Position = pcVar5;
  } while (bVar6);
  this->Current = pcVar5;
  skipComment(this);
  if (this->Current == this->End) {
    local_48 = &local_38;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_60.decUI = 0x13;
    local_50 = (long)this->Current - (long)pcVar1;
    local_58 = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_60);
    *IsDone = true;
    std::__cxx11::string::_M_dispose();
    bVar6 = true;
  }
  else {
    bVar3 = consumeLineBreakIfPresent(this);
    bVar6 = true;
    if (!bVar3) {
      Twine::Twine((Twine *)&local_60,"Expected a line break after block scalar header");
      setError(this,(Twine *)&local_60,this->Current);
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool Scanner::scanBlockScalarHeader(char &ChompingIndicator,
                                    unsigned &IndentIndicator, bool &IsDone) {
  auto Start = Current;

  ChompingIndicator = scanBlockChompingIndicator();
  IndentIndicator = scanBlockIndentationIndicator();
  // Check for the chomping indicator once again.
  if (ChompingIndicator == ' ')
    ChompingIndicator = scanBlockChompingIndicator();
  Current = skip_while(&Scanner::skip_s_white, Current);
  skipComment();

  if (Current == End) { // EOF, we have an empty scalar.
    Token T;
    T.Kind = Token::TK_BlockScalar;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    IsDone = true;
    return true;
  }

  if (!consumeLineBreakIfPresent()) {
    setError("Expected a line break after block scalar header", Current);
    return false;
  }
  return true;
}